

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O0

subtree_ref_base<true> * __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::subtree_ref_base<true>::child
          (subtree_ref_base<true> *this,size_t k)

{
  value_type index;
  size_t sVar1;
  value_type vVar2;
  subtree_ref_base<true> *psVar3;
  size_t sVar4;
  value_type vVar5;
  subtree_ref_base<true> *in_RDX;
  subtree_ref_base<true> *in_RSI;
  subtree_ref_base<true> *in_RDI;
  size_t r;
  size_t s;
  size_t h;
  size_t p;
  size_t in_stack_fffffffffffffee8;
  subtree_ref_base<true> *in_stack_fffffffffffffef0;
  size_t local_108;
  size_t local_f0;
  size_t local_e0;
  
  pointers(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  index = const_item_reference::operator_cast_to_unsigned_long
                    ((const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                      *)0x162c08);
  sVar1 = height(in_RSI);
  if (in_RDX == (subtree_ref_base<true> *)0x0) {
    sizes(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    local_e0 = const_item_reference::operator_cast_to_unsigned_long
                         ((const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                           *)0x162c60);
  }
  else {
    psVar3 = (subtree_ref_base<true> *)degree(in_RSI);
    if (in_RDX == psVar3) {
      local_f0 = size(in_RSI);
      sizes(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      vVar5 = const_item_reference::operator_cast_to_unsigned_long
                        ((const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                          *)0x162cd0);
      local_f0 = local_f0 - vVar5;
    }
    else {
      sizes(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      vVar5 = const_item_reference::operator_cast_to_unsigned_long
                        ((const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                          *)0x162d11);
      sizes(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      vVar2 = const_item_reference::operator_cast_to_unsigned_long
                        ((const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                          *)0x162d49);
      local_f0 = vVar5 - vVar2;
    }
    local_e0 = local_f0;
  }
  if (in_RDX == (subtree_ref_base<true> *)0x0) {
    ranks(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    local_108 = const_item_reference::operator_cast_to_unsigned_long
                          ((const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                            *)0x162daa);
  }
  else {
    psVar3 = (subtree_ref_base<true> *)degree(in_RSI);
    if (in_RDX == psVar3) {
      sVar4 = rank(in_RSI);
      ranks(in_RDX,in_stack_fffffffffffffee8);
      local_108 = const_item_reference::operator_cast_to_unsigned_long
                            ((const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                              *)0x162e1a);
      local_108 = sVar4 - local_108;
    }
    else {
      ranks(in_RDX,in_stack_fffffffffffffee8);
      local_108 = const_item_reference::operator_cast_to_unsigned_long
                            ((const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                              *)0x162e55);
      ranks(in_RDX,in_stack_fffffffffffffee8);
      vVar5 = const_item_reference::operator_cast_to_unsigned_long
                        ((const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                          *)0x162e83);
      local_108 = local_108 - vVar5;
    }
  }
  subtree_ref_base(in_RDI,in_RSI->_vector,index,sVar1 - 1,local_e0,local_108);
  return in_RDI;
}

Assistant:

subtree_ref_base child(size_t k) const
            {
                assert(is_node());
                assert(k <= degree());
                assert(pointers(k) != 0);
                
                size_t p = pointers(k);
                size_t h = height() - 1;
                
                // Size of the subtree
                size_t s = k == 0        ? sizes(k) :
                           k == degree() ? size()   - sizes(k - 1) :
                                           sizes(k) - sizes(k - 1);
                
                // Rank of the subtree
                size_t r = k == 0        ? ranks(k) :
                           k == degree() ? rank()   - ranks(k - 1) :
                                           ranks(k) - ranks(k - 1);
                
                return { _vector, p, h, s, r };
            }